

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  pointer *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)16>_> data;
  allocator<char> local_119;
  string local_118;
  Move<vk::Handle<(vk::HandleType)16>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> obj;
  Resources res;
  Environment env;
  Parameters *params_local;
  Context *context_local;
  
  this = &res.pSetLayouts.
          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Environment::Environment((Environment *)this,context,1);
  this_00 = &obj.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  PipelineLayout::Resources::Resources((Resources *)this_00,(Environment *)this,params);
  PipelineLayout::create(&local_e8,(Environment *)this,(Resources *)this_00,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
  data.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
  data.object.m_internal = local_c8.object.m_internal;
  data.deleter.m_device = local_c8.deleter.m_device;
  data.deleter.m_allocator = local_c8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_a8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"Ok",&local_119);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  PipelineLayout::Resources::~Resources
            ((Resources *)
             &obj.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}